

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeSolver.h
# Opt level: O1

void pica::YeeSolver::Implementation<(pica::Dimension)3,_double>::updateB
               (YeeGrid<(pica::Dimension)3,_double> *grid,double dt)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  pointer pdVar9;
  long lVar10;
  pointer pdVar11;
  pointer pdVar12;
  double *pdVar13;
  int iVar14;
  pointer pdVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  pointer pdVar19;
  pointer pdVar20;
  ulong uVar21;
  long lVar22;
  double *pdVar23;
  int iVar24;
  double *pdVar25;
  int iVar26;
  long lVar27;
  pointer pdVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  double *pdVar32;
  ulong uVar33;
  double *pdVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  uint local_9c;
  int local_88;
  
  dVar35 = dt * 29979245800.0;
  dVar37 = dVar35 / (grid->super_Grid<(pica::Dimension)3,_double>).step.x;
  dVar36 = dVar35 / (grid->super_Grid<(pica::Dimension)3,_double>).step.y;
  dVar35 = dVar35 / (grid->super_Grid<(pica::Dimension)3,_double>).step.z;
  uVar2._0_4_ = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.x;
  uVar2._4_4_ = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
  uVar1 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.z;
  lVar10 = (long)(int)uVar1;
  if (1 < (int)(undefined4)uVar2) {
    local_9c = 1;
    iVar3 = 0;
    do {
      if (1 < (int)uVar2._4_4_) {
        iVar14 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
        lVar5 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
        iVar30 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
        lVar8 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
        lVar17 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
        pdVar12 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar31 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
        lVar27 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
        pdVar28 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y *
                              local_9c) + 1) * lVar27 + 1;
        lVar22 = (long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y * local_9c
                            );
        lVar29 = (long)pdVar12 + lVar10 * 8 * lVar22 + 8;
        pdVar15 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y *
                              local_9c) + 1) * lVar31 + 1;
        lVar6 = (long)pdVar12 + (lVar22 + 1) * lVar10 * 8 + 8;
        pdVar20 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((long)(int)((grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.y *
                              local_9c) + 1) * lVar17 + 1;
        lVar18 = (long)(int)(iVar30 * local_9c);
        pdVar12 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar9 = pdVar12 + ((long)(iVar30 * iVar3) + 1) * lVar8 + 1;
        lVar22 = (long)pdVar12 + lVar8 * 8 * lVar18 + 8;
        pdVar12 = pdVar12 + (lVar18 + 1) * lVar8 + 1;
        pdVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar19 = pdVar11 + ((long)(iVar14 * iVar3) + 1) * lVar5 + 1;
        pdVar11 = pdVar11 + ((long)(int)(iVar14 * local_9c) + 1) * lVar5 + 1;
        uVar33 = 1;
        do {
          if (1 < (int)uVar1) {
            lVar18 = 0;
            do {
              *(double *)((long)pdVar20 + lVar18) =
                   (*(double *)((long)pdVar11 + lVar18) - *(double *)((long)pdVar11 + lVar18 + -8))
                   * dVar35 +
                   (*(double *)((long)pdVar12 + lVar18) - *(double *)(lVar22 + lVar18)) * -dVar36 +
                   *(double *)((long)pdVar20 + lVar18);
              *(double *)((long)pdVar15 + lVar18) =
                   (*(double *)((long)pdVar12 + lVar18) - *(double *)((long)pdVar9 + lVar18)) *
                   dVar37 + (*(double *)(lVar6 + lVar18) - *(double *)(lVar6 + lVar18 + -8)) *
                            -dVar35 + *(double *)((long)pdVar15 + lVar18);
              *(double *)((long)pdVar28 + lVar18) =
                   (*(double *)(lVar6 + lVar18) - *(double *)(lVar29 + lVar18)) * dVar36 +
                   (*(double *)((long)pdVar11 + lVar18) - *(double *)((long)pdVar19 + lVar18)) *
                   -dVar37 + *(double *)((long)pdVar28 + lVar18);
              lVar18 = lVar18 + 8;
            } while ((ulong)uVar1 * 8 + -8 != lVar18);
          }
          uVar33 = uVar33 + 1;
          pdVar28 = pdVar28 + lVar27;
          pdVar19 = pdVar19 + lVar5;
          lVar29 = lVar29 + lVar10 * 8;
          pdVar15 = pdVar15 + lVar31;
          lVar6 = lVar6 + lVar10 * 8;
          pdVar9 = pdVar9 + lVar8;
          pdVar20 = pdVar20 + lVar17;
          lVar22 = lVar22 + lVar8 * 8;
          pdVar12 = pdVar12 + lVar8;
          pdVar11 = pdVar11 + lVar5;
        } while (uVar33 != uVar2 >> 0x20);
      }
      local_9c = local_9c + 1;
      iVar3 = iVar3 + 1;
    } while (local_9c != (undefined4)uVar2);
  }
  if (1 < (int)(undefined4)uVar2) {
    lVar22 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y;
    lVar5 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.y;
    lVar6 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
    pdVar15 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar9 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar8 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.y;
    lVar17 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bzData.size.z;
    lVar18 = lVar22 * lVar10;
    pdVar12 = pdVar15 + (lVar22 + 1) * lVar10;
    pdVar11 = pdVar9 + (lVar5 + 1) * lVar6;
    lVar5 = lVar5 * lVar6;
    pdVar9 = pdVar9 + lVar6;
    pdVar7 = (grid->super_Grid<(pica::Dimension)3,_double>).bzData.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + (lVar8 + 1) * lVar17;
    uVar33 = 1;
    do {
      pdVar15 = pdVar15 + lVar18;
      if (1 < (int)uVar2._4_4_) {
        lVar29 = 0;
        lVar27 = 0;
        pdVar23 = pdVar7;
        lVar22 = (uVar2 >> 0x20) - 1;
        do {
          *pdVar23 = (*(double *)((long)pdVar12 + lVar27) - *(double *)((long)pdVar15 + lVar27)) *
                     dVar36 + (*(double *)((long)pdVar11 + lVar29) -
                              *(double *)((long)pdVar9 + lVar29)) * -dVar37 + *pdVar23;
          lVar27 = lVar27 + lVar10 * 8;
          lVar29 = lVar29 + lVar6 * 8;
          pdVar23 = pdVar23 + lVar17;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      uVar33 = uVar33 + 1;
      pdVar12 = pdVar12 + lVar18;
      pdVar11 = pdVar11 + lVar5;
      pdVar9 = pdVar9 + lVar5;
      pdVar7 = pdVar7 + lVar8 * lVar17;
    } while (uVar33 != ((undefined4)uVar2 & 0x7fffffff));
  }
  if (1 < (int)(undefined4)uVar2) {
    pdVar12 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar11 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar16 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.y *
             (grid->super_Grid<(pica::Dimension)3,_double>).byData.size.z;
    pdVar9 = (grid->super_Grid<(pica::Dimension)3,_double>).byData.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar24 = (grid->super_Grid<(pica::Dimension)3,_double>).exData.size.y * uVar1;
    iVar4 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z *
            (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.y;
    uVar33 = 1;
    iVar26 = 0;
    iVar3 = iVar4;
    iVar14 = iVar24;
    iVar30 = iVar16;
    do {
      if (1 < (int)uVar1) {
        uVar21 = 1;
        do {
          pdVar9[(long)iVar30 + uVar21] =
               (pdVar12[(long)iVar3 + uVar21] - pdVar12[(long)iVar26 + uVar21]) * dVar37 +
               (pdVar11[(long)iVar14 + uVar21] - pdVar11[(long)iVar14 + (uVar21 - 1)]) * -dVar35 +
               pdVar9[(long)iVar30 + uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar1 != uVar21);
      }
      uVar33 = uVar33 + 1;
      iVar30 = iVar30 + iVar16;
      iVar14 = iVar14 + iVar24;
      iVar26 = iVar26 + iVar4;
      iVar3 = iVar3 + iVar4;
    } while (uVar33 != ((undefined4)uVar2 & 0x7fffffff));
  }
  if (1 < (int)uVar2._4_4_) {
    lVar10 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).eyData.size.z;
    iVar3 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.size.z;
    lVar22 = (long)(grid->super_Grid<(pica::Dimension)3,_double>).bxData.size.z;
    pdVar23 = (grid->super_Grid<(pica::Dimension)3,_double>).eyData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar10 + 1;
    pdVar25 = (grid->super_Grid<(pica::Dimension)3,_double>).bxData.data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar22 + 1;
    pdVar7 = (grid->super_Grid<(pica::Dimension)3,_double>).ezData.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    uVar33 = 1;
    do {
      pdVar13 = pdVar7;
      lVar5 = (ulong)uVar1 - 1;
      pdVar32 = pdVar25;
      pdVar34 = pdVar23;
      if (1 < (int)uVar1) {
        do {
          *pdVar32 = (*pdVar34 - pdVar34[-1]) * dVar35 + (pdVar13[iVar3] - *pdVar13) * -dVar36 +
                     *pdVar32;
          pdVar34 = pdVar34 + 1;
          pdVar32 = pdVar32 + 1;
          pdVar13 = pdVar13 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      uVar33 = uVar33 + 1;
      pdVar23 = pdVar23 + lVar10;
      pdVar25 = pdVar25 + lVar22;
      pdVar7 = pdVar7 + iVar3;
    } while (uVar33 != uVar2 >> 0x20);
  }
  return;
}

Assistant:

static void updateB(YeeGrid<Three, Real>& grid, Real dt)
    {
        typedef typename YeeGrid<Three, Real>::ValueType ValueType;
        typedef typename YeeGrid<Three, Real>::PositionType PositionType;
        const ValueType cdt = Constants<ValueType>::c() * dt;
        const PositionType coeff = PositionType(cdt, cdt, cdt) / grid.getStep();
        typedef typename YeeGrid<Three, Real>::IndexType IndexType;
        const IndexType begin(1, 1, 1);
        const IndexType end = grid.getSize();
        #pragma omp parallel for collapse(2)
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++) {
            grid.bx(i, j, k) += coeff.z * (grid.ey(i, j, k) - grid.ey(i, j, k - 1)) -
                coeff.y * (grid.ez(i, j, k) - grid.ez(i, j - 1, k));
            grid.by(i, j, k) += coeff.x * (grid.ez(i, j, k) - grid.ez(i - 1, j, k)) -
                coeff.z * (grid.ex(i, j, k) - grid.ex(i, j, k - 1));
            grid.bz(i, j, k) += coeff.y * (grid.ex(i, j, k) - grid.ex(i, j - 1, k)) -
                coeff.x * (grid.ey(i, j, k) - grid.ey(i - 1, j, k));
        }
        // Edges
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int j = begin.y; j < end.y; j++)
            grid.bz(i, j, 0) += coeff.y * (grid.ex(i, j, 0) - grid.ex(i, j - 1, 0)) -
                coeff.x * (grid.ey(i, j, 0) - grid.ey(i - 1, j, 0));
        #pragma omp parallel for
        for (int i = begin.x; i < end.x; i++)
        for (int k = begin.z; k < end.z; k++)
            grid.by(i, 0, k) += coeff.x * (grid.ez(i, 0, k) - grid.ez(i - 1, 0, k)) -
                coeff.z * (grid.ex(i, 0, k) - grid.ex(i, 0, k - 1));
        #pragma omp parallel for
        for (int j = begin.y; j < end.y; j++)
        for (int k = begin.z; k < end.z; k++)
            grid.bx(0, j, k) += coeff.z * (grid.ey(0, j, k) - grid.ey(0, j, k - 1)) -
                coeff.y * (grid.ez(0, j, k) - grid.ez(0, j - 1, k));
    }